

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_texshader.cpp
# Opt level: O0

FString __thiscall FTextureShader::CreateName(FTextureShader *this)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  FShaderLayer **ppFVar5;
  long in_RSI;
  uint local_20;
  uint i;
  FTextureShader *this_local;
  FString *compose;
  
  FString::FString((FString *)this,"custom");
  for (local_20 = 0;
      uVar4 = TArray<FShaderLayer_*,_FShaderLayer_*>::Size
                        ((TArray<FShaderLayer_*,_FShaderLayer_*> *)(in_RSI + 8)), local_20 < uVar4;
      local_20 = local_20 + 1) {
    ppFVar5 = TArray<FShaderLayer_*,_FShaderLayer_*>::operator[]
                        ((TArray<FShaderLayer_*,_FShaderLayer_*> *)(in_RSI + 8),(ulong)local_20);
    bVar1 = (*ppFVar5)->emissive;
    ppFVar5 = TArray<FShaderLayer_*,_FShaderLayer_*>::operator[]
                        ((TArray<FShaderLayer_*,_FShaderLayer_*> *)(in_RSI + 8),(ulong)local_20);
    uVar4 = (*ppFVar5)->blendFuncSrc;
    ppFVar5 = TArray<FShaderLayer_*,_FShaderLayer_*>::operator[]
                        ((TArray<FShaderLayer_*,_FShaderLayer_*> *)(in_RSI + 8),(ulong)local_20);
    uVar3 = (*ppFVar5)->blendFuncDst;
    ppFVar5 = TArray<FShaderLayer_*,_FShaderLayer_*>::operator[]
                        ((TArray<FShaderLayer_*,_FShaderLayer_*> *)(in_RSI + 8),(ulong)local_20);
    bVar2 = (*ppFVar5)->texgen;
    ppFVar5 = TArray<FShaderLayer_*,_FShaderLayer_*>::operator[]
                        ((TArray<FShaderLayer_*,_FShaderLayer_*> *)(in_RSI + 8),(ulong)local_20);
    FString::AppendFormat
              ((FString *)this,"@%de%ds%ud%ut%dw%d",(ulong)local_20,(ulong)(bVar1 & 1),(ulong)uVar4,
               (ulong)uVar3,(uint)bVar2,(uint)(*ppFVar5)->warp);
  }
  return (FString)(char *)this;
}

Assistant:

FString FTextureShader::CreateName()
{
	FString compose = "custom";
	for(unsigned i=0; i<layers.Size(); i++)
	{
		compose.AppendFormat("@%de%ds%ud%ut%dw%d", i, layers[i]->emissive, 
			layers[i]->blendFuncSrc, layers[i]->blendFuncDst, layers[i]->texgen, layers[i]->warp);
	}
	return compose;
}